

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O3

void __thiscall crsGA::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer this_00;
  
  LOCK();
  (this->stop)._M_base._M_i = true;
  UNLOCK();
  ThreadSafeQueue<std::function<void_()>_>::notify_and_terminate(&this->tasks);
  pSVar1 = (this->workers).
           super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->workers).
           super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      ScopedThread::~ScopedThread(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
    (this->workers).super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::~vector(&this->workers);
  std::condition_variable::~condition_variable(&(this->tasks)._data_cond);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)&this->tasks
            );
  return;
}

Assistant:

inline ThreadPool::~ThreadPool()
{
    stop = true;
    tasks.notify_and_terminate();
    workers.clear();
}